

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall solitaire::graphics::Renderer::renderFoundationPile(Renderer *this,PileId *id)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  Position local_30;
  PileId local_24;
  PileId local_20;
  uint local_1c;
  
  iVar1 = (*this->context->_vptr_Context[5])();
  local_1c = id->t;
  plVar2 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x68))
                             ((long *)CONCAT44(extraout_var,iVar1));
  plVar2 = (long *)(**(code **)(*plVar2 + 0x30))(plVar2);
  if (*plVar2 == plVar2[1]) {
    local_20 = (PileId)id->t;
    local_30 = getFoundationPilePosition(this,&local_20);
    renderCardPlaceholder(this,&local_30);
  }
  else {
    local_24 = (PileId)id->t;
    local_30 = getFoundationPilePosition(this,&local_24);
    renderCard(this,&local_30,(Card *)(plVar2[1] + -8));
  }
  return;
}

Assistant:

void Renderer::renderFoundationPile(const PileId id) const {
    const auto& pileCards = context.getSolitaire().getFoundationPile(id).getCards();

    if (pileCards.empty())
        renderCardPlaceholder(getFoundationPilePosition(id));
    else
        renderCard(getFoundationPilePosition(id), pileCards.back());
}